

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O2

void __thiscall duckdb::ArenaChunk::ArenaChunk(ArenaChunk *this,Allocator *allocator,idx_t size)

{
  AllocatedData AStack_38;
  
  AllocatedData::AllocatedData(&this->data);
  this->current_position = 0;
  this->maximum_size = size;
  (this->next).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
  super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
  this->prev = (ArenaChunk *)0x0;
  Allocator::Allocate(&AStack_38,allocator,size);
  AllocatedData::operator=(&this->data,&AStack_38);
  AllocatedData::~AllocatedData(&AStack_38);
  return;
}

Assistant:

ArenaChunk::ArenaChunk(Allocator &allocator, idx_t size) : current_position(0), maximum_size(size), prev(nullptr) {
	D_ASSERT(size > 0);
	data = allocator.Allocate(size);
}